

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

town_conflict * town_by_name(level_map *map,char *name)

{
  town_conflict *ptVar1;
  int iVar2;
  char *__s2;
  level_conflict *lev;
  town_conflict *town;
  wchar_t i;
  char *name_local;
  level_map *map_local;
  
  if (name != (char *)0x0) {
    for (town._4_4_ = 0; town._4_4_ < map->num_towns; town._4_4_ = town._4_4_ + 1) {
      ptVar1 = map->towns;
      __s2 = level_name(map->levels + ptVar1[town._4_4_].index);
      iVar2 = strcmp(name,__s2);
      if (iVar2 == 0) {
        return ptVar1 + town._4_4_;
      }
    }
  }
  return (town_conflict *)0x0;
}

Assistant:

struct town *town_by_name(struct level_map *map, const char *name)
{
	int i;

	/* No hometown */
	if (!name) return NULL;

	for (i = 0; i < map->num_towns; i++) {
		struct town *town = &map->towns[i];
		struct level *lev = &map->levels[town->index];
		if (streq(name, level_name(lev))) {
			return town;
		}
	}
	return NULL;
}